

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOAddIntArray(FmsIOContext *ctx,char *path,FmsInt *values,FmsInt n)

{
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  FmsInt j;
  FmsInt i;
  ulong local_38;
  ulong local_30;
  int local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 1;
  }
  else if (in_RSI == 0) {
    local_4 = 2;
  }
  else {
    fprintf((FILE *)*in_RDI,"%s/Size: %lu\n",in_RSI,in_RCX);
    fprintf((FILE *)*in_RDI,"%s/Type: %s\n",in_RSI,"FMS_UINT64");
    if (in_RCX != 0) {
      fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
      for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
        for (local_38 = 0; local_38 < 3 && local_30 < in_RCX; local_38 = local_38 + 1) {
          fprintf((FILE *)*in_RDI,"%lu",*(undefined8 *)(in_RDX + local_30 * 8));
          if (local_30 < in_RCX - 1) {
            fprintf((FILE *)*in_RDI,", ");
          }
          local_30 = local_30 + 1;
        }
        if (local_30 < in_RCX - 1) {
          fprintf((FILE *)*in_RDI,"\n");
        }
      }
      fprintf((FILE *)*in_RDI,"]\n");
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
FmsIOAddIntArray(FmsIOContext *ctx, const char *path, const FmsInt *values,
                 FmsInt n) {
  FmsInt i, j;
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  fprintf(ctx->fp, "%s/Size: " FMS_LU "\n", path, n);
  fprintf(ctx->fp, "%s/Type: %s\n", path, FmsIntTypeNames[FMS_UINT64]);

  if(n) {
    /* Should we make it YAML-like?*/
    fprintf(ctx->fp, "%s/Values: [", path);
    for(i = 0; i < n; ++i) {
      for(j = 0; j < FMS_ELE_PER_LINE && i < n; j++, i++) {
        fprintf(ctx->fp, FMS_LU, values[i]);
        if(i < n-1)
          fprintf(ctx->fp, ", ");
      }
      if(i < n-1)
        fprintf(ctx->fp, "\n");
    }
    fprintf(ctx->fp, "]\n");
  }
  return 0;
}